

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_response.cc
# Opt level: O3

void __thiscall LookupResponse::LookupResponse(LookupResponse *this)

{
  BlockInfo *this_00;
  
  NamenodeResponse::NamenodeResponse(&this->super_NamenodeResponse);
  (this->super_NamenodeResponse).super_RpcMessage._vptr_RpcMessage =
       (_func_int **)&PTR_Update_00130850;
  FileInfo::FileInfo(&this->file_info_);
  this_00 = (BlockInfo *)operator_new(0x40);
  BlockInfo::BlockInfo(this_00);
  (this->block_info_).super___shared_ptr<BlockInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<BlockInfo*>
            (&(this->block_info_).super___shared_ptr<BlockInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  return;
}

Assistant:

LookupResponse::LookupResponse()
    : NamenodeResponse(), block_info_(new BlockInfo()) {}